

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionHandler::handleExpr<char_const*const&>
          (AssertionHandler *this,ExprLhs<const_char_*const_&> *expr)

{
  ITransientExpression local_20;
  char **local_10;
  
  local_10 = expr->m_lhs;
  local_20.m_result = *local_10 != (char *)0x0;
  local_20.m_isBinaryExpression = false;
  local_20._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001a9528;
  handleExpr(this,&local_20);
  ITransientExpression::~ITransientExpression(&local_20);
  return;
}

Assistant:

auto makeUnaryExpr() const -> UnaryExpr<LhsT> {
            return UnaryExpr<LhsT>{ m_lhs };
        }